

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_defined_units.cpp
# Opt level: O0

void __thiscall
unitStringDefinitions_customaryDuplicates_Test::~unitStringDefinitions_customaryDuplicates_Test
          (unitStringDefinitions_customaryDuplicates_Test *this)

{
  unitStringDefinitions_customaryDuplicates_Test *this_local;
  
  ~unitStringDefinitions_customaryDuplicates_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(unitStringDefinitions, customaryDuplicates)
{
    std::map<std::string, units::precise_unit> testMap;
    for (const auto& ustring : units::defined_unit_strings_customary) {
        if (ustring.first == nullptr) {
            continue;
        }
        auto res = testMap.emplace(ustring.first, ustring.second);
        EXPECT_TRUE(res.second) << "duplicate unit string " << ustring.first;
    }
}